

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall
Fossilize::StateRecorder::init_recording_thread(StateRecorder *this,DatabaseInterface *iface)

{
  undefined4 uVar1;
  Impl *pIVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  long *in_FS_OFFSET;
  bool bVar7;
  thread local_38;
  long *local_30;
  
  pIVar2 = this->impl;
  pIVar2->database_iface = iface;
  (pIVar2->record_data).write_database_entries = true;
  (pIVar2->record_data).payload_flags = 0;
  (pIVar2->record_data).need_flush = false;
  (pIVar2->record_data).need_prepare = true;
  puVar3 = (pIVar2->record_data).blob.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (pIVar2->record_data).blob.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (pIVar2->record_data).blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar2->record_data).blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar2->record_data).blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  pIVar2 = this->impl;
  if (pIVar2->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = pIVar2->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  pIVar2->should_record_identifier_only = bVar7;
  lVar5 = *in_FS_OFFSET;
  uVar1 = *(undefined4 *)(lVar5 + -0x18);
  lVar6 = *(long *)(lVar5 + -0x10);
  lVar5 = *(long *)(lVar5 + -8);
  local_38._M_id._M_thread = (id)0;
  local_30 = (long *)operator_new(0x28);
  *local_30 = (long)&PTR___State_0016abc0;
  *(undefined4 *)(local_30 + 1) = uVar1;
  local_30[2] = lVar6;
  local_30[3] = lVar5;
  local_30[4] = (long)this;
  std::thread::_M_start_thread(&local_38,&local_30,0);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  if ((this->impl->worker_thread)._M_id._M_thread == 0) {
    (this->impl->worker_thread)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void StateRecorder::init_recording_thread(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;

	auto level = get_thread_log_level();
	auto cb = Internal::get_thread_log_callback();
	auto userdata = Internal::get_thread_log_userdata();
	impl->worker_thread = std::thread([=]() {
		set_thread_log_level(level);
		set_thread_log_callback(cb, userdata);
		impl->record_task(this, true);
	});
}